

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_close(AMQP_VALUE value,CLOSE_HANDLE *close_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  CLOSE_HANDLE pCVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  ERROR_HANDLE error;
  uint32_t local_34;
  ERROR_HANDLE local_30;
  
  pCVar4 = (CLOSE_HANDLE)malloc(8);
  if (pCVar4 == (CLOSE_HANDLE)0x0) {
    *close_handle = (CLOSE_HANDLE)0x0;
    iVar3 = 0x26e8;
  }
  else {
    pCVar4->composite_value = (AMQP_VALUE)0x0;
    *close_handle = pCVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      close_destroy(*close_handle);
      iVar3 = 0x26f0;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_34);
      iVar3 = 0x26f7;
      if (iVar1 == 0) {
        if ((local_34 != 0) &&
           (pAVar5 = amqpvalue_get_list_item(pAVar5,0), pAVar5 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if (AVar2 != AMQP_TYPE_NULL) {
            iVar3 = amqpvalue_get_error(pAVar5,&local_30);
            if (iVar3 != 0) {
              amqpvalue_destroy(pAVar5);
              close_destroy(*close_handle);
              return 0x2713;
            }
            error_destroy(local_30);
          }
          amqpvalue_destroy(pAVar5);
        }
        pAVar5 = amqpvalue_clone(value);
        pCVar4->composite_value = pAVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_close(AMQP_VALUE value, CLOSE_HANDLE* close_handle)
{
    int result;
    CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close_create_internal();
    *close_handle = close_instance;
    if (*close_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            close_destroy(*close_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* error */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    close_destroy(*close_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    close_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}